

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O1

void decodeTriple(char *result,int *difx,int *dify)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  int iVar4;
  
  pbVar3 = (byte *)(result + 1);
  iVar2 = (int)(char)decodeChar_decode_chars[(byte)*result];
  if (iVar2 < 0x18) {
    iVar4 = 0;
    while( true ) {
      bVar1 = *pbVar3;
      if ((bVar1 == 0) || (bVar1 == 0x2e)) break;
      pbVar3 = pbVar3 + 1;
      iVar4 = (int)(char)decodeChar_decode_chars[bVar1] + iVar4 * 0x1f;
    }
    *difx = (iVar2 % 6) * 0x1c + iVar4 / 0x22;
    *dify = iVar4 % 0x22 + (iVar2 / 6) * 0x22;
    return;
  }
  iVar4 = 0;
  while( true ) {
    bVar1 = *pbVar3;
    if ((bVar1 == 0) || (bVar1 == 0x2e)) break;
    pbVar3 = pbVar3 + 1;
    iVar4 = (int)(char)decodeChar_decode_chars[bVar1] + iVar4 * 0x1f;
  }
  *dify = iVar4 % 0x28 + 0x88;
  *difx = iVar4 / 0x28 + iVar2 * 0x18 + -0x240;
  return;
}

Assistant:

static void decodeTriple(const char *result, int *difx, int *dify) {
    // decode the first character
    const int c1 = decodeChar(*result++);
    ASSERT(result);
    ASSERT(difx);
    ASSERT(dify);
    if (c1 < 24) {
        int m = decodeBase31(result);
        *difx = (c1 % 6) * 28 + (m / 34);
        *dify = (c1 / 6) * 34 + (m % 34);
    } else // bottom row
    {
        int x = decodeBase31(result);
        *dify = (x % 40) + 136;
        *difx = (x / 40) + 24 * (c1 - 24);
    }
}